

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureSocket.cpp
# Opt level: O0

ssize_t __thiscall
Jupiter::SecureSocket::recv(SecureSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SSL *ssl;
  Buffer *this_00;
  void *buf;
  size_t sVar1;
  int r;
  Buffer *buffer;
  SecureSocket *this_local;
  
  if (this->m_ssl_data->handle == (SSL *)0x0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this_00 = Socket::getInternalBuffer(&this->super_Socket);
    Socket::Buffer::clear(this_00);
    ssl = (SSL *)this->m_ssl_data->handle;
    buf = Socket::Buffer::data(this_00);
    sVar1 = Socket::getBufferSize(&this->super_Socket);
    this_local._4_4_ = SSL_read(ssl,buf,(int)sVar1);
    if (0 < (int)this_local._4_4_) {
      Socket::Buffer::set_length(this_00,(long)(int)this_local._4_4_);
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int Jupiter::SecureSocket::recv() {
	if (m_ssl_data->handle == nullptr)
		return -1;
	Jupiter::Socket::Buffer &buffer = this->getInternalBuffer();
	buffer.clear();
	int r = SSL_read(m_ssl_data->handle, buffer.data(), static_cast<int>(this->getBufferSize()));
	if (r > 0)
		buffer.set_length(r);
	return r;
}